

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

int __thiscall
cmGeneratedFileStreamBase::CompressFile
          (cmGeneratedFileStreamBase *this,string *oldname,string *newname)

{
  int iVar1;
  gzFile file;
  FILE *__stream;
  size_t sVar2;
  char buffer [1024];
  undefined1 auStack_428 [1032];
  
  file = cm_zlib_gzopen((newname->_M_dataplus)._M_p,"w");
  iVar1 = 0;
  if ((file != (gzFile)0x0) &&
     (__stream = (FILE *)cmsys::SystemTools::Fopen(oldname,"r"), iVar1 = 0, __stream != (FILE *)0x0)
     ) {
    do {
      sVar2 = fread(auStack_428,1,0x400,__stream);
      if (sVar2 == 0) {
        iVar1 = 1;
        goto LAB_001f596b;
      }
      iVar1 = cm_zlib_gzwrite(file,auStack_428,(uint)sVar2);
    } while (iVar1 != 0);
    iVar1 = 0;
LAB_001f596b:
    fclose(__stream);
    cm_zlib_gzclose(file);
  }
  return iVar1;
}

Assistant:

int cmGeneratedFileStreamBase::CompressFile(std::string const& oldname,
                                            std::string const& newname)
{
  gzFile gf = gzopen(newname.c_str(), "w");
  if (!gf) {
    return 0;
  }
  FILE* ifs = cmsys::SystemTools::Fopen(oldname, "r");
  if (!ifs) {
    return 0;
  }
  size_t res;
  const size_t BUFFER_SIZE = 1024;
  char buffer[BUFFER_SIZE];
  while ((res = fread(buffer, 1, BUFFER_SIZE, ifs)) > 0) {
    if (!gzwrite(gf, buffer, static_cast<int>(res))) {
      fclose(ifs);
      gzclose(gf);
      return 0;
    }
  }
  fclose(ifs);
  gzclose(gf);
  return 1;
}